

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject_p.h
# Opt level: O0

void __thiscall QObjectPrivate::ExtraData::~ExtraData(ExtraData *this)

{
  QObjectCompatProperty<QObjectPrivate::ExtraData,_QString,_&QObjectPrivate::ExtraData::_qt_property_objectName_offset,_&QObjectPrivate::ExtraData::setObjectNameForwarder,_&QObjectPrivate::ExtraData::nameChangedForwarder,_nullptr>
  ::~QObjectCompatProperty
            ((QObjectCompatProperty<QObjectPrivate::ExtraData,_QString,_&QObjectPrivate::ExtraData::_qt_property_objectName_offset,_&QObjectPrivate::ExtraData::setObjectNameForwarder,_&QObjectPrivate::ExtraData::nameChangedForwarder,_nullptr>
              *)0x3fd170);
  QList<QPointer<QObject>_>::~QList((QList<QPointer<QObject>_> *)0x3fd17e);
  QList<Qt::TimerId>::~QList((QList<Qt::TimerId> *)0x3fd18c);
  QList<QVariant>::~QList((QList<QVariant> *)0x3fd19a);
  QList<QByteArray>::~QList((QList<QByteArray> *)0x3fd1a4);
  return;
}

Assistant:

ExtraData(QObjectPrivate *ptr) : parent(ptr) { }